

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildCallCommon
          (IRBuilder *this,Instr *instr,StackSym *symDst,ArgSlot argCount,CallFlags flags)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  IntConstOpnd *pIVar9;
  uint32 uVar10;
  char *message;
  char *error;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Func *this_01;
  uint uVar11;
  Instr *this_02;
  
  OVar1 = instr->m_opcode;
  this_00 = this->m_argStack;
  if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
      (this_00->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this_00) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1a7b,"(!m_argStack->Empty())","!m_argStack->Empty()");
    if (!bVar3) goto LAB_004996c4;
    *puVar7 = 0;
    this_00 = this->m_argStack;
  }
  uVar11 = 0;
  this_02 = instr;
  while( true ) {
    pIVar8 = SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_00);
    if (pIVar8 == (Instr *)0x0) break;
    if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
        (this->m_argStack->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argStack) {
      if (pIVar8->m_opcode != StartCall) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x1a86,
                           "(argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall)",
                           "argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall");
        if (!bVar3) goto LAB_004996c4;
        *puVar7 = 0;
      }
      break;
    }
    if (pIVar8->m_opcode == StartCall) break;
    IR::Instr::SetSrc2(this_02,pIVar8->m_dst);
    uVar11 = uVar11 + 1;
    this_00 = this->m_argStack;
    this_02 = pIVar8;
  }
  if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->m_argStack->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argStack) {
    this->callTreeHasSomeProfileInfo = false;
  }
  uVar5 = OVar1 - 0xc4;
  if (((uVar5 < 6) && ((0x29U >> (uVar5 & 0x1f) & 1) != 0)) || (OVar1 == 0x160)) {
    uVar11 = uVar11 + 1;
    this->m_argsOnStack = this->m_argsOnStack + 1;
  }
  AVar4 = Js::CallInfo::GetArgCountWithExtraArgs(flags,(uint)argCount);
  uVar5 = (uint)AVar4;
  if (pIVar8 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    error = "(false)";
    message = "Expect StartCall on other opcodes...";
    uVar6 = 0x1aa3;
LAB_004995dd:
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,uVar6,error,message);
    if (!bVar3) goto LAB_004996c4;
    *puVar7 = 0;
  }
  else {
    IR::Instr::SetSrc2(this_02,pIVar8->m_dst);
    if (instr->m_prev->m_opcode != LdSpreadIndices) {
      bVar3 = IR::Opnd::IsIntConstOpnd(pIVar8->m_src1);
      if (bVar3) {
        pIVar9 = IR::Opnd::AsIntConstOpnd(pIVar8->m_src1);
        if ((uVar11 == uVar5) && ((pIVar9->super_EncodableOpnd<long>).m_value == (long)(int)uVar11))
        goto LAB_004995ee;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      error = 
      "(instr->m_prev->m_opcode == Js::OpCode::LdSpreadIndices || (argInstr->GetSrc1()->IsIntConstOpnd() && argInstr->GetSrc1()->AsIntConstOpnd()->GetValue() == count && count == argCount))"
      ;
      message = "StartCall has wrong number of arguments...";
      uVar6 = 0x1a9f;
      goto LAB_004995dd;
    }
  }
LAB_004995ee:
  uVar10 = this->m_callsOnStack - 1;
  this->m_callsOnStack = uVar10;
  this_01 = this->m_func;
  uVar11 = this->m_argsOnStack;
  if (this_01->m_argSlotsForFunctionsCalled < uVar11) {
    this_01->m_argSlotsForFunctionsCalled = uVar11;
  }
  if (uVar11 != uVar5 && uVar10 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1aaf,"(m_argsOnStack == argCount)","m_argsOnStack == argCount");
    if (!bVar3) {
LAB_004996c4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    uVar11 = this->m_argsOnStack;
    this_01 = this->m_func;
  }
  this->m_argsOnStack = uVar11 - uVar5;
  bVar3 = Func::IsJitInDebugMode(this_01);
  if (bVar3) {
    uVar6 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
    InsertBailOutForDebugger
              (this,uVar6,
               BailOutIgnoreException|BailOutStep|BailOutLocalValueChanged|BailOutStackFrameBase|
               BailOutBreakPointInFunction|BailOutForceByFlag,(Instr *)0x0);
    return;
  }
  return;
}

Assistant:

void
IRBuilder::BuildCallCommon(IR::Instr * instr, StackSym * symDst, Js::ArgSlot argCount, Js::CallFlags flags)
{
    Js::OpCode newOpcode = instr->m_opcode;

    IR::Instr *     argInstr = nullptr;
    IR::Instr *     prevInstr = instr;
#if DBG
    int count = 0;
#endif

    // Link all the args of this call by creating a def/use chain through the src2.
    AssertOrFailFast(!m_argStack->Empty());
    for (argInstr = m_argStack->Pop();
        argInstr && !m_argStack->Empty() && argInstr->m_opcode != Js::OpCode::StartCall;
        argInstr = m_argStack->Pop())
    {
        prevInstr->SetSrc2(argInstr->GetDst());
        prevInstr = argInstr;
#if DBG
        count++;
#endif
    }
    AssertOrFailFast(argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall);

    if (m_argStack->Empty())
    {
        this->callTreeHasSomeProfileInfo = false;
    }

    if (newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjArray
        || newOpcode == Js::OpCode::NewScObjectSpread || newOpcode == Js::OpCode::NewScObjArraySpread)
    {
#if DBG
        count++;
#endif
        m_argsOnStack++;
    }

    argCount = Js::CallInfo::GetArgCountWithExtraArgs(flags, argCount);

    if (argInstr)
    {
        prevInstr->SetSrc2(argInstr->GetDst());
        AssertMsg(instr->m_prev->m_opcode == Js::OpCode::LdSpreadIndices
            // All non-spread calls need StartCall to have the same number of args
            || (argInstr->GetSrc1()->IsIntConstOpnd()
                    && argInstr->GetSrc1()->AsIntConstOpnd()->GetValue() == count
                    && count == argCount), "StartCall has wrong number of arguments...");
    }
    else
    {
        AssertMsg(false, "Expect StartCall on other opcodes...");
    }

    // Update Func if this is the highest amount of stack we've used so far
    // to push args.
#if DBG
    m_callsOnStack--;
#endif
    if (m_func->m_argSlotsForFunctionsCalled < m_argsOnStack)
        m_func->m_argSlotsForFunctionsCalled = m_argsOnStack;
#if DBG
    if (m_callsOnStack == 0)
        Assert(m_argsOnStack == argCount);
#endif
    m_argsOnStack -= argCount;

    if (m_func->IsJitInDebugMode())
    {
        // Insert bailout after return from a call, script or library function call.
        this->InsertBailOutForDebugger(
            m_jnReader.GetCurrentOffset(), // bailout will resume at the offset of next instr.
            c_debuggerBailOutKindForCall);
    }
}